

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::RunContext::resetAssertionInfo(RunContext *this)

{
  StringRef local_28;
  
  local_28.m_start = "";
  local_28.m_size = 0;
  local_28.m_data = (char *)0x0;
  StringRef::operator=(&(this->m_lastAssertionInfo).macroName,&local_28);
  StringRef::~StringRef(&local_28);
  local_28.m_start = "{Unknown expression after the reported line}";
  local_28.m_size = 0x2c;
  local_28.m_data = (char *)0x0;
  StringRef::operator=(&(this->m_lastAssertionInfo).capturedExpression,&local_28);
  StringRef::~StringRef(&local_28);
  return;
}

Assistant:

void RunContext::resetAssertionInfo() {
        m_lastAssertionInfo.macroName = StringRef();
        m_lastAssertionInfo.capturedExpression = "{Unknown expression after the reported line}"_sr;
    }